

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Binding>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> values)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  size_t sVar2;
  size_t amount;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar3;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> local_50;
  Binding *local_40;
  size_t local_38;
  
  sVar2 = values.size_;
  if (sVar2 == 0) {
    this_00 = (HashIndex<kj::_::HashSetCallbacks> *)0x0;
    sVar2 = 0;
  }
  else {
    amount = sVar2 << 4;
    pAVar1 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .rows.builder.ptr;
    this_00 = (HashIndex<kj::_::HashSetCallbacks> *)&local_50;
    table.size_ = (size_t)pAVar1;
    table.ptr = (ArrayPtr<const_unsigned_char> *)
                &(this->dedupTable).
                 super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 .indexes;
    local_40 = values.ptr;
    local_38 = amount;
    kj::HashIndex<kj::_::HashSetCallbacks>::
    find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
              (this_00,table,
               (ArrayPtr<const_unsigned_char> *)
               ((long)(this->dedupTable).
                      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                      .rows.builder.pos - (long)pAVar1 >> 4));
    pAVar1 = (this->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .rows.builder.ptr;
    local_50.ptr._0_1_ = pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0 & (byte)local_50.ptr;
    if ((byte)local_50.ptr == 1) {
      this_00 = (HashIndex<kj::_::HashSetCallbacks> *)pAVar1[local_50.size_].ptr;
    }
    if ((byte)local_50.ptr == 0) {
      this_00 = (HashIndex<kj::_::HashSetCallbacks> *)
                kj::Arena::allocateBytes(&this->arena,amount,8,false);
      memcpy(this_00,values.ptr,amount);
      local_50.ptr = (uchar *)this_00;
      local_50.size_ = amount;
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_50);
    }
  }
  AVar3.size_ = sVar2;
  AVar3.ptr = (Binding *)this_00;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_MAYBE(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe->begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}